

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

Operator *
Operator::unary(Operator *__return_storage_ptr__,OperatorChar op,int precedence,
               OperatorAssociativity associativity,UnaryOperatorFn *applyFn)

{
  OperatorChar local_80;
  function<ResultValue_(ResultValue)> local_70;
  function<ResultValue_(ResultValue,_ResultValue)> local_50;
  undefined2 local_2c;
  undefined1 local_2a;
  UnaryOperatorFn *local_28;
  UnaryOperatorFn *applyFn_local;
  int local_18;
  OperatorAssociativity associativity_local;
  int precedence_local;
  OperatorChar op_local;
  
  local_2c = op._0_2_;
  local_2a = op.mOp2;
  local_28 = applyFn;
  applyFn_local._4_4_ = associativity;
  local_18 = precedence;
  associativity_local._1_2_ = local_2c;
  associativity_local._3_1_ = local_2a;
  _precedence_local = __return_storage_ptr__;
  std::function<ResultValue_(ResultValue,_ResultValue)>::function(&local_50);
  std::function<ResultValue_(ResultValue)>::function(&local_70,applyFn);
  local_80.mOp2 = local_2a;
  local_80.mIsTwoChars = (bool)(undefined1)local_2c;
  local_80.mOp1 = local_2c._1_1_;
  Operator(__return_storage_ptr__,local_80,precedence,associativity,true,&local_50,&local_70);
  std::function<ResultValue_(ResultValue)>::~function(&local_70);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Operator Operator::unary(OperatorChar op, int precedence, OperatorAssociativity associativity, UnaryOperatorFn applyFn) {
	return Operator(op, precedence, associativity, true, {}, applyFn);
}